

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_add_asn1_oid_from_text(CBB *cbb,char *text,size_t len)

{
  int iVar1;
  size_t sVar2;
  ulong local_48;
  uint64_t b;
  uint64_t a;
  CBS cbs;
  size_t len_local;
  char *text_local;
  CBB *cbb_local;
  
  cbs.len = len;
  iVar1 = CBB_flush(cbb);
  if (iVar1 != 0) {
    CBS_init((CBS *)&a,(uint8_t *)text,cbs.len);
    iVar1 = parse_dotted_decimal((CBS *)&a,&b);
    if ((((iVar1 != 0) && (iVar1 = parse_dotted_decimal((CBS *)&a,&local_48), iVar1 != 0)) &&
        (b < 3)) && (((1 < b || (local_48 < 0x28)) && (local_48 < 0xffffffffffffffb0)))) {
      iVar1 = add_base128_integer(cbb,b * 0x28 + local_48);
      while (iVar1 != 0) {
        sVar2 = CBS_len((CBS *)&a);
        if (sVar2 == 0) {
          return 1;
        }
        iVar1 = parse_dotted_decimal((CBS *)&a,&b);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = add_base128_integer(cbb,b);
      }
    }
  }
  return 0;
}

Assistant:

int CBB_add_asn1_oid_from_text(CBB *cbb, const char *text, size_t len) {
  if (!CBB_flush(cbb)) {
    return 0;
  }

  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)text, len);

  // OIDs must have at least two components.
  uint64_t a, b;
  if (!parse_dotted_decimal(&cbs, &a) || !parse_dotted_decimal(&cbs, &b)) {
    return 0;
  }

  // The first component is encoded as 40 * |a| + |b|. This assumes that |a| is
  // 0, 1, or 2 and that, when it is 0 or 1, |b| is at most 39.
  if (a > 2 || (a < 2 && b > 39) || b > UINT64_MAX - 80 ||
      !add_base128_integer(cbb, 40u * a + b)) {
    return 0;
  }

  // The remaining components are encoded unmodified.
  while (CBS_len(&cbs) > 0) {
    if (!parse_dotted_decimal(&cbs, &a) || !add_base128_integer(cbb, a)) {
      return 0;
    }
  }

  return 1;
}